

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromisehelpers.h
# Opt level: O0

Type __thiscall QtPromise::resolve<QList<int>>(QtPromise *this,QList<int> *value)

{
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<int>_>_> extraout_RDX;
  Type TVar1;
  anon_class_8_1_a8c68091 local_20;
  QList<int> *local_18;
  QList<int> *value_local;
  
  local_20.value = value;
  local_18 = value;
  value_local = (QList<int> *)this;
  QPromise<QList<int>>::
  QPromise<QtPromise::resolve<QList<int>>(QList<int>&&)::_lambda(QtPromise::QPromiseResolve<QList<int>>&&,QtPromise::QPromiseReject<QList<int>>&&)_1_>
            ((QPromise<QList<int>> *)this,&local_20);
  TVar1.super_QPromiseBase<QList<int>_>.m_d.d = extraout_RDX.d;
  TVar1.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)this;
  return (Type)TVar1.super_QPromiseBase<QList<int>_>;
}

Assistant:

static inline typename QtPromisePrivate::PromiseDeduce<T>::Type resolve(T&& value)
{
    using namespace QtPromisePrivate;
    using PromiseType = typename PromiseDeduce<T>::Type;
    using ValueType = typename PromiseType::Type;
    using ResolveType = QPromiseResolve<ValueType>;
    using RejectType = QPromiseReject<ValueType>;

    return PromiseType{[&](ResolveType&& resolve, RejectType&& reject) {
        PromiseFulfill<Unqualified<T>>::call(std::forward<T>(value),
                                             std::forward<ResolveType>(resolve),
                                             std::forward<RejectType>(reject));
    }};
}